

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

shared_ptr<const_fasttext::Matrix> __thiscall fasttext::FastText::getInputMatrix(FastText *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_fasttext::Matrix> sVar1;
  
  std::__shared_ptr<fasttext::Matrix_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fasttext::Matrix,void>
            ((__shared_ptr<fasttext::Matrix_const,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x20));
  sVar1.super___shared_ptr<const_fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_fasttext::Matrix>)
         sVar1.super___shared_ptr<const_fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Matrix> FastText::getInputMatrix() const {
  return input_;
}